

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void pk_record(CHAR_DATA *ch,CHAR_DATA *victim)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  float fVar3;
  float fVar4;
  int i;
  float victim_credit;
  float killer_credit;
  int killer_in_room;
  int victim_group;
  int killer_group;
  CHAR_DATA *wch;
  CHAR_DATA *in_stack_ffffffffffffff98;
  CHAR_DATA *in_stack_ffffffffffffffa0;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  int iVar6;
  int iVar7;
  CHAR_DATA *pCVar8;
  
  iVar7 = 0;
  iVar6 = 0;
  iVar5 = 0;
  bVar1 = is_npc(in_stack_ffffffffffffff98);
  if ((!bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffff98), pCVar8 = char_list, !bVar1)) {
    for (; pCVar8 != (CHAR_DATA *)0x0; pCVar8 = pCVar8->next) {
      bVar1 = is_same_group(pCVar8,in_RDI);
      if (((bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffff98), !bVar1)) &&
         ((pCVar8->in_room == in_RDI->in_room || (0 < pCVar8->ghost)))) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
        fmt._M_len._4_4_ = iVar7;
        fmt._M_len._0_4_ = iVar6;
        fmt._M_str = (char *)pCVar8;
        CLogger::Info<char*&>
                  ((CLogger *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),fmt,
                   (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar7 = iVar7 + 1;
      }
      bVar1 = is_same_group(pCVar8,in_RDI);
      if (((bVar1) && (pCVar8->in_room == in_RDI->in_room)) &&
         (bVar1 = is_npc(in_stack_ffffffffffffff98), !bVar1)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
        fmt_00._M_len._4_4_ = iVar7;
        fmt_00._M_len._0_4_ = iVar6;
        fmt_00._M_str = (char *)pCVar8;
        CLogger::Info<char*&>
                  ((CLogger *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),fmt_00,
                   (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar5 = iVar5 + 1;
      }
      bVar1 = is_same_group(pCVar8,in_RSI);
      if ((bVar1) && ((pCVar8->in_room == in_RSI->in_room || (0 < pCVar8->ghost)))) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
        fmt_01._M_len._4_4_ = iVar7;
        fmt_01._M_len._0_4_ = iVar6;
        fmt_01._M_str = (char *)pCVar8;
        CLogger::Info<char*&>
                  ((CLogger *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),fmt_01,
                   (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar6 = iVar6 + 1;
      }
    }
    fVar3 = (float)(iVar6 / iVar7);
    if (1.0 < fVar3) {
      fVar3 = 1.0;
    }
    fVar4 = fVar3 / (float)iVar5;
    in_RSI->pcdata->fragged = fVar3 + in_RSI->pcdata->fragged;
    for (pCVar8 = char_list; pCVar8 != (CHAR_DATA *)0x0; pCVar8 = pCVar8->next) {
      bVar1 = is_same_group(pCVar8,in_RDI);
      if (((bVar1) && (bVar1 = can_pk(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0), bVar1))
         && ((bVar1 = is_npc(in_stack_ffffffffffffff98), !bVar1 &&
             (pCVar8->in_room == in_RDI->in_room)))) {
        pCVar8->pcdata->frags[0] = fVar4 + pCVar8->pcdata->frags[0];
        bVar1 = is_good(in_stack_ffffffffffffff98);
        if (bVar1) {
          pCVar8->pcdata->frags[1] = fVar4 + pCVar8->pcdata->frags[1];
        }
        else {
          bVar1 = is_neutral(in_stack_ffffffffffffff98);
          if (bVar1) {
            pCVar8->pcdata->frags[2] = fVar4 + pCVar8->pcdata->frags[2];
          }
          else {
            bVar1 = is_evil(in_stack_ffffffffffffff98);
            if (bVar1) {
              pCVar8->pcdata->frags[3] = fVar4 + pCVar8->pcdata->frags[3];
            }
          }
        }
        if (pCVar8->level < 0x33) {
          iVar7 = 0;
          while (((iVar7 < 100 && (pCVar8->pcdata->recentkills[iVar7] != (char *)0x0)) &&
                 (*pCVar8->pcdata->recentkills[iVar7] != '\0'))) {
            iVar7 = iVar7 + 1;
          }
          if (iVar7 < 0x5f) {
            pcVar2 = palloc_string(in_stack_ffffffffffffffc8);
            pCVar8->pcdata->recentkills[iVar7] = pcVar2;
          }
        }
      }
    }
    in_RDI->pcdata->kills[0] = in_RDI->pcdata->kills[0] + 1;
    if (in_RSI->alignment < 1) {
      if (in_RSI->alignment == 0) {
        in_RDI->pcdata->kills[2] = in_RDI->pcdata->kills[2] + 1;
      }
      else if (in_RSI->alignment < 0) {
        in_RDI->pcdata->kills[3] = in_RDI->pcdata->kills[3] + 1;
      }
    }
    else {
      in_RDI->pcdata->kills[1] = in_RDI->pcdata->kills[1] + 1;
    }
    in_RSI->pcdata->killed[0] = in_RSI->pcdata->killed[0] + 1;
    if (in_RDI->level < 0x33) {
      iVar7 = 0;
      while (((iVar7 < 100 && (in_RDI->pcdata->recentkills[iVar7] != (char *)0x0)) &&
             (*in_RDI->pcdata->recentkills[iVar7] != '\0'))) {
        iVar7 = iVar7 + 1;
      }
      if (iVar7 < 0x5f) {
        pcVar2 = palloc_string(in_stack_ffffffffffffffc8);
        in_RDI->pcdata->recentkills[iVar7] = pcVar2;
      }
    }
  }
  return;
}

Assistant:

void pk_record(CHAR_DATA *ch, CHAR_DATA *victim)
{
	CHAR_DATA *wch;
	int killer_group = 0, victim_group = 0;
	int killer_in_room = 0;
	float killer_credit, victim_credit;
	int i;

	if (is_npc(victim) || is_npc(ch))
		return;

	for (wch = char_list; wch; wch = wch->next)
	{
		if (is_same_group(wch, ch) && !is_npc(wch) && (wch->in_room == ch->in_room || wch->ghost > 0))
		{
			RS.Logger.Info("Adding {} to killer_group", wch->name);
			killer_group++;
		}

		if (is_same_group(wch, ch) && wch->in_room == ch->in_room && !is_npc(wch))
		{
			RS.Logger.Info("Adding {} to killer_in_room", wch->name);
			killer_in_room++;
		}

		if (is_same_group(wch, victim) && (wch->in_room == victim->in_room || wch->ghost > 0))
		{
			RS.Logger.Info("Adding {} to victim_group.", wch->name);
			victim_group++;
		}
	}

	victim_credit = (float)(victim_group / killer_group);

	if (victim_credit > 1)
		victim_credit = 1;

	killer_credit = victim_credit;
	killer_credit = killer_credit / killer_in_room;
	victim->pcdata->fragged += victim_credit;

	for (wch = char_list; wch; wch = wch->next)
	{
		if (is_same_group(wch, ch) && can_pk(wch, victim) && !is_npc(wch) && wch->in_room == ch->in_room)
		{
			wch->pcdata->frags[PK_KILLS] += killer_credit;

			if (is_good(victim))
				wch->pcdata->frags[PK_GOOD] += killer_credit;
			else if (is_neutral(victim))
				wch->pcdata->frags[PK_NEUTRAL] += killer_credit;
			else if (is_evil(victim))
				wch->pcdata->frags[PK_EVIL] += killer_credit;

			if (wch->level < 51)
			{
				for (i = 0; i < 100; i++)
				{
					if (wch->pcdata->recentkills[i] == nullptr)
						break;

					if (*(wch->pcdata->recentkills[i]) == '\0')
						break;
				}

				if (i < 95)
					wch->pcdata->recentkills[i] = palloc_string(victim->name);
			}
		}
	}

	ch->pcdata->kills[PK_KILLS]++;

	if (victim->alignment > 0)
		ch->pcdata->kills[PK_GOOD]++;
	else if (victim->alignment == 0)
		ch->pcdata->kills[PK_NEUTRAL]++;
	else if (victim->alignment < 0)
		ch->pcdata->kills[PK_EVIL]++;

	victim->pcdata->killed[PK_KILLED]++;

	if (ch->level < 51)
	{
		for (i = 0; i < 100; i++)
		{
			if (ch->pcdata->recentkills[i] == nullptr)
				break;

			if (*(ch->pcdata->recentkills[i]) == '\0')
				break;
		}

		if (i < 95)
			ch->pcdata->recentkills[i] = palloc_string(victim->name);
	}
}